

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

void mp_next(char **data)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int64_t k;
  long lVar5;
  
  pbVar4 = (byte *)*data;
  k = 1;
  do {
    bVar1 = *pbVar4;
    pbVar3 = pbVar4 + 1;
    *data = (char *)pbVar3;
    lVar5 = (long)""[bVar1];
    if (lVar5 < 0) {
      if (bVar1 == 0xd9) {
        pbVar3 = pbVar4 + (ulong)pbVar4[1] + 2;
        goto LAB_0013c314;
      }
      if ((byte)""[bVar1] < 0xe1) {
        *data = (char *)pbVar4;
        mp_next_slowpath(data,k);
        return;
      }
      k = k - lVar5;
    }
    else {
      pbVar3 = pbVar3 + lVar5;
LAB_0013c314:
      *data = (char *)pbVar3;
    }
    bVar2 = k < 2;
    pbVar4 = pbVar3;
    k = k + -1;
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

MP_IMPL void
mp_next(const char **data)
{
	int64_t k = 1;
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			*data += l;
			continue;
		} else if (mp_likely(c == 0xd9)){
			/* MP_STR (8) */
			uint8_t len = mp_load_u8(data);
			*data += len;
			continue;
		} else if (l > MP_HINT) {
			k -= l;
			continue;
		} else {
			*data -= sizeof(uint8_t);
			mp_next_slowpath(data, k);
			return;
		}
	}
}